

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O1

int32 rw::d3d8::getStride(uint32 flags,int32 numTex)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = flags >> 1 & 4;
  iVar2 = uVar1 + 0x18 + numTex * 8;
  if ((flags & 0x10) == 0) {
    iVar2 = uVar1 + 0xc + numTex * 8;
  }
  return iVar2;
}

Assistant:

int32
getStride(uint32 flags, int32 numTex)
{
	int32 stride = 12;
	if(flags & Geometry::NORMALS)
		stride += 12;;
	if(flags & Geometry::PRELIT)
		stride += 4;
	stride += numTex*8;
	return stride;
}